

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexeme.cpp
# Opt level: O0

void __thiscall psy::C::Lexeme::checkVariousPrefixesAndSuffixes(Lexeme *this)

{
  iterator pcVar1;
  iterator local_20;
  char *cur;
  char *kEnd;
  Lexeme *this_local;
  
  pcVar1 = TextElement::end(&this->super_TextElement);
  for (local_20 = TextElement::begin(&this->super_TextElement); local_20 != pcVar1;
      local_20 = local_20 + 1) {
    switch(*local_20) {
    case 'F':
    case 'f':
      (this->field_0).BD_ = (this->field_0).BD_ & 0xf7ff | 0x800;
      break;
    case 'L':
      if ((local_20 + 1 == pcVar1) || (local_20[1] != 'L')) {
        (this->field_0).BD_ = (this->field_0).BD_ & 0xffbf | 0x40;
      }
      else {
        (this->field_0).BD_ = (this->field_0).BD_ & 0xfbff | 0x400;
        local_20 = local_20 + 1;
      }
      break;
    case 'U':
      (this->field_0).BD_ = (this->field_0).BD_ & 0xfdff | 0x200;
      break;
    case 'l':
      if ((local_20 + 1 == pcVar1) || (local_20[1] != 'l')) {
        (this->field_0).BD_ = (this->field_0).BD_ & 0xffdf | 0x20;
      }
      else {
        (this->field_0).BD_ = (this->field_0).BD_ & 0xfbff | 0x400;
        local_20 = local_20 + 1;
      }
      break;
    case 'u':
      if ((local_20 + 1 == pcVar1) || (local_20[1] != '8')) {
        (this->field_0).BD_ = (this->field_0).BD_ & 0xff7f | 0x80;
      }
      else {
        (this->field_0).BD_ = (this->field_0).BD_ & 0xfeff | 0x100;
        local_20 = local_20 + 1;
      }
    }
  }
  return;
}

Assistant:

void Lexeme::checkVariousPrefixesAndSuffixes()
{
    const char* kEnd = end();
    for (const char* cur = begin(); cur != kEnd; ++cur) {
        switch (*cur) {
            case 'l':
                if (cur + 1 != kEnd && *(cur + 1 ) == 'l') {
                    F_.llOrLL_ = 1;
                    ++cur;
                }
                else
                    F_.l_ = 1;
                break;

            case 'L':
                if (cur + 1 != kEnd && *(cur + 1) == 'L') {
                    F_.llOrLL_ = 1;
                    ++cur;
                }
                else
                    F_.L_ = 1;
                break;

            case 'u':
                if (cur + 1 != kEnd && *(cur + 1 ) == '8') {
                    F_.u8_ = 1;
                    ++cur;
                }
                else
                    F_.u_ = 1;
                break;

            case 'U':
                F_.U_ = 1;
                break;

            case 'f':
            case 'F':
                F_.fOrF_ = 1;
                break;
        }
    }
}